

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsPrimaryTypes.cpp
# Opt level: O2

void helics::valueExtract
               (defV *data,vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *val
               )

{
  pointer pcVar1;
  pointer pdVar2;
  pointer pdVar3;
  variant_alternative_t<0UL,_variant<double,_long,_basic_string<char,_char_traits<char>,_allocator<char>_>,_complex<double>,_vector<double,_allocator<double>_>,_vector<complex<double>,_allocator<complex<double>_>_>,_NamedPoint>_>
  *__args;
  variant_alternative_t<3UL,_variant<double,_long,_basic_string<char,_char_traits<char>,_allocator<char>_>,_complex<double>,_vector<double,_allocator<double>_>,_vector<complex<double>,_allocator<complex<double>_>_>,_NamedPoint>_>
  *__x;
  variant_alternative_t<6UL,_variant<double,_long,_basic_string<char,_char_traits<char>,_allocator<char>_>,_complex<double>,_vector<double,_allocator<double>_>,_vector<complex<double>,_allocator<complex<double>_>_>,_NamedPoint>_>
  *pvVar4;
  variant_alternative_t<2UL,_variant<double,_long,_basic_string<char,_char_traits<char>,_allocator<char>_>,_complex<double>,_vector<double,_allocator<double>_>,_vector<complex<double>,_allocator<complex<double>_>_>,_NamedPoint>_>
  *pvVar5;
  variant_alternative_t<1UL,_variant<double,_long,_basic_string<char,_char_traits<char>,_allocator<char>_>,_complex<double>,_vector<double,_allocator<double>_>,_vector<complex<double>,_allocator<complex<double>_>_>,_NamedPoint>_>
  *pvVar6;
  variant_alternative_t<4UL,_variant<double,_long,_basic_string<char,_char_traits<char>,_allocator<char>_>,_complex<double>,_vector<double,_allocator<double>_>,_vector<complex<double>,_allocator<complex<double>_>_>,_NamedPoint>_>
  *pvVar7;
  variant_alternative_t<5UL,_variant<double,_long,_basic_string<char,_char_traits<char>,_allocator<char>_>,_complex<double>,_vector<double,_allocator<double>_>,_vector<complex<double>,_allocator<complex<double>_>_>,_NamedPoint>_>
  *__x_00;
  uint *puVar8;
  ulong uVar9;
  size_t ii;
  ulong uVar10;
  long lVar11;
  string_view val_00;
  string_view val_01;
  _Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_> local_40;
  double local_28;
  
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::resize(val,0);
  puVar8 = &switchD_0020a909::switchdataD_0036827c;
  switch((data->
         super__Variant_base<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
         ).
         super__Move_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
         .
         super__Copy_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
         .
         super__Move_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
         .
         super__Copy_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
         .
         super__Variant_storage_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
         ._M_index) {
  case '\0':
    __args = std::
             get<0ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                       (data);
    break;
  case '\x01':
    pvVar6 = std::
             get<1ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                       (data);
    local_40._M_impl.super__Vector_impl_data._M_start = (pointer)(double)*pvVar6;
    local_28 = 0.0;
    std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
    emplace_back<double,double>
              ((vector<std::complex<double>,std::allocator<std::complex<double>>> *)val,
               (double *)&local_40,&local_28);
    return;
  default:
    pvVar5 = std::
             get<2ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                       (data);
    val_01._M_str = (pvVar5->_M_dataplus)._M_p;
    val_01._M_len = pvVar5->_M_string_length;
    helicsGetComplexVector(val_01,val);
    return;
  case '\x03':
    __x = std::
          get<3ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                    (data);
    std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::push_back(val,__x);
    return;
  case '\x04':
    pvVar7 = std::
             get<4ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                       (data);
    std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::reserve
              (val,(long)(pvVar7->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(pvVar7->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start >> 3);
    pcVar1 = (val->super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>)
             ._M_impl.super__Vector_impl_data._M_start;
    if ((val->super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
        _M_impl.super__Vector_impl_data._M_finish != pcVar1) {
      (val->super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
      _M_impl.super__Vector_impl_data._M_finish = pcVar1;
    }
    lVar11 = 0;
    uVar10 = 0;
    while( true ) {
      pdVar2 = (pvVar7->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pdVar3 = (pvVar7->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      uVar9 = (long)pdVar3 - (long)pdVar2;
      if (((long)uVar9 >> 3) - 1U <= uVar10) break;
      std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
      emplace_back<double_const&,double_const&>
                ((vector<std::complex<double>,std::allocator<std::complex<double>>> *)val,
                 (double *)((long)pdVar2 + lVar11),(double *)((long)pdVar2 + lVar11 + 8));
      uVar10 = uVar10 + 2;
      lVar11 = lVar11 + 0x10;
    }
    if ((uVar9 & 8) == 0) {
      return;
    }
    __args = pdVar3 + -1;
    break;
  case '\x05':
    __x_00 = std::
             get<5ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                       (data);
    std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator=(val,__x_00)
    ;
    return;
  case '\x06':
    pvVar4 = std::
             get<6ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                       (data);
    if (!NAN(pvVar4->value)) {
      std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::resize(val,1);
      pcVar1 = (val->
               super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
      *(double *)pcVar1->_M_value = pvVar4->value;
      *(undefined8 *)(pcVar1->_M_value + 8) = 0;
      return;
    }
    val_00._M_str = (char *)puVar8;
    val_00._M_len = (size_t)(pvVar4->name)._M_dataplus._M_p;
    helicsGetComplexVector
              ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&local_40,
               (helics *)(pvVar4->name)._M_string_length,val_00);
    CLI::std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::_M_move_assign
              ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)val,&local_40
              );
    CLI::std::_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>::
    ~_Vector_base(&local_40);
    return;
  }
  local_40._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
  emplace_back<double_const&,double>
            ((vector<std::complex<double>,std::allocator<std::complex<double>>> *)val,__args,
             (double *)&local_40);
  return;
}

Assistant:

void valueExtract(const defV& data, std::vector<std::complex<double>>& val)
{
    val.resize(0);
    switch (data.index()) {
        case double_loc:  // double
            val.emplace_back(std::get<double>(data), 0.0);
            break;
        case int_loc:  // int64_t
            val.emplace_back(static_cast<double>(std::get<int64_t>(data)), 0.0);
            break;
        case string_loc:  // string
        default:
            helicsGetComplexVector(std::get<std::string>(data), val);
            break;
        case complex_loc:  // complex
        {
            val.push_back(std::get<std::complex<double>>(data));
        } break;
        case vector_loc:  // vector
        {
            const auto& vec = std::get<std::vector<double>>(data);
            val.reserve(vec.size() + 1 / 2);
            val.clear();
            for (size_t ii = 0; ii < vec.size() - 1; ii += 2) {
                val.emplace_back(vec[ii], vec[ii + 1]);
            }
            if (vec.size() % 2 == 1) {
                val.emplace_back(vec.back(), 0.0);
            }
            break;
        }
        case complex_vector_loc:  // complex
            val = std::get<std::vector<std::complex<double>>>(data);
            break;
        case named_point_loc:  // named point
        {
            const auto& point = std::get<NamedPoint>(data);
            if (std::isnan(point.value)) {
                val = helicsGetComplexVector(point.name);
            } else {
                val.resize(1);
                val[0] = std::complex<double>(point.value, 0.0);
            }
            break;
        }
    }
}